

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O0

void fc_input_acks(fc_s *fc,uint32_t una,uint32_t nacks)

{
  uint32_t nacks_local;
  uint32_t una_local;
  fc_s *fc_local;
  
  if (fc->in_trouble == '\0') {
    fc_normal_acks(fc,nacks);
  }
  else {
    if (fc->max_lost_sn < una) {
      fc->cwnd = fc->ssthresh + 1;
      fc->in_trouble = '\0';
      fc->max_lost_sn = 0;
    }
    else {
      fc->cwnd = nacks + fc->cwnd;
    }
    fc->incr = (float)(fc->cwnd * fc->MSS);
  }
  return;
}

Assistant:

void fc_input_acks(fc_s *fc, const uint32_t una, uint32_t nacks) {
    if (fc->in_trouble) {
        if (una > fc->max_lost_sn) {    // new data arrives
            fc->cwnd = fc->ssthresh + 1;
            fc->in_trouble = 0;
            fc->max_lost_sn = 0;
        } else {
            fc->cwnd += nacks;
        }
        fc->incr = fc->cwnd * fc->MSS;
    } else {
        fc_normal_acks(fc, nacks);
    }

}